

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psft.c
# Opt level: O2

FT_Error cf2_getSeacComponent(PS_Decoder *decoder,FT_Fast code,CF2_Buffer buf)

{
  CFF_Font_conflict pCVar1;
  FT_UShort FVar2;
  FT_Error FVar3;
  FT_Byte *pFVar4;
  FT_UInt FVar5;
  ulong uVar6;
  TT_Face pTVar7;
  FT_ULong len;
  FT_Byte *charstring;
  
  uVar6 = (ulong)(uint)code;
  buf->end = (FT_Byte *)0x0;
  buf->ptr = (FT_Byte *)0x0;
  buf->error = (FT_Error *)0x0;
  buf->start = (FT_Byte *)0x0;
  pTVar7 = (TT_Face)(decoder->builder).face;
  if (((pTVar7->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) {
    FVar3 = 0x12;
    if (((uint)code < 0x100) && (pCVar1 = decoder->cff, (pCVar1->charset).sids != (FT_UShort *)0x0))
    {
      FVar2 = (**pCVar1->cffload)(code);
      uVar6 = 0;
      while (FVar5 = (FT_UInt)uVar6, pCVar1->num_glyphs != FVar5) {
        if ((pCVar1->charset).sids[uVar6] == FVar2) {
          if ((int)FVar5 < 0) {
            return 0x12;
          }
          pTVar7 = (TT_Face)(decoder->builder).face;
          goto LAB_001f8c31;
        }
        uVar6 = (ulong)(FVar5 + 1);
      }
    }
  }
  else {
LAB_001f8c31:
    FVar3 = (*decoder->get_glyph_callback)(pTVar7,(FT_UInt)uVar6,&charstring,&len);
    if (FVar3 == 0) {
      buf->start = charstring;
      pFVar4 = charstring + len;
      if (charstring == (FT_Byte *)0x0) {
        pFVar4 = (FT_Byte *)0x0;
      }
      buf->end = pFVar4;
      buf->ptr = charstring;
      FVar3 = 0;
    }
  }
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cf2_getSeacComponent( PS_Decoder*  decoder,
                        CF2_Int      code,
                        CF2_Buffer   buf )
  {
    CF2_Int   gid;
    FT_Byte*  charstring;
    FT_ULong  len;
    FT_Error  error;


    FT_ASSERT( decoder );
    FT_ASSERT( !decoder->builder.is_t1 );

    FT_ZERO( buf );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    /* Incremental fonts don't necessarily have valid charsets.        */
    /* They use the character code, not the glyph index, in this case. */
    if ( decoder->builder.face->internal->incremental_interface )
      gid = code;
    else
#endif /* FT_CONFIG_OPTION_INCREMENTAL */
    {
      gid = cff_lookup_glyph_by_stdcharcode( decoder->cff, code );
      if ( gid < 0 )
        return FT_THROW( Invalid_Glyph_Format );
    }

    error = decoder->get_glyph_callback( (TT_Face)decoder->builder.face,
                                         (CF2_UInt)gid,
                                         &charstring,
                                         &len );
    /* TODO: for now, just pass the FreeType error through */
    if ( error )
      return error;

    /* assume input has been validated */
    FT_ASSERT( charstring + len >= charstring );

    buf->start = charstring;
    buf->end   = FT_OFFSET( charstring, len );
    buf->ptr   = buf->start;

    return FT_Err_Ok;
  }